

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

bool __thiscall ON_3dVector::IsNotZero(ON_3dVector *this)

{
  byte bVar1;
  
  bVar1 = 0;
  if ((ABS(this->x) < 1.23432101234321e+308) &&
     (bVar1 = 0, this->z != 0.0 || (this->x != 0.0 || this->y != 0.0))) {
    bVar1 = -(ABS(this->z) < 1.23432101234321e+308) & -(ABS(this->y) < 1.23432101234321e+308);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ON_3dVector::IsNotZero() const
{
  // the UNSET tests also insure x, y, and z are not nans.
  return
    (x != 0.0 || y != 0.0 || z != 0.0)
    && x > ON_UNSET_VALUE && x < ON_UNSET_POSITIVE_VALUE
    && y > ON_UNSET_VALUE && y < ON_UNSET_POSITIVE_VALUE
    && z > ON_UNSET_VALUE && z < ON_UNSET_POSITIVE_VALUE
    ;
}